

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::
GenerateDynamicMethodNewBuildMessageInfo(ImmutableMessageLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  int iVar1;
  uint32_t uVar2;
  JavaType JVar3;
  OneofGeneratorInfo *args_1;
  _Base_ptr p_Var4;
  ImmutableFieldLiteGenerator *pIVar5;
  Descriptor *pDVar6;
  ulong extraout_RDX;
  int i_3;
  int i_2;
  int iVar7;
  uint32_t uVar8;
  long lVar9;
  int i;
  long lVar10;
  java *this_01;
  int i_1;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  sorted_fields;
  vector<unsigned_short,_std::allocator<unsigned_short>_> chars;
  string line;
  FieldDescriptor *local_38;
  
  io::Printer::Indent(printer);
  chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar6 = (this->super_MessageGenerator).descriptor_;
  bVar13 = *(char *)(*(long *)(pDVar6 + 0x10) + 0x3a) == '\x02';
  uVar8 = bVar13 + 2;
  if (*(char *)(*(long *)(pDVar6 + 0x20) + 0x48) == '\0') {
    uVar8 = (uint32_t)bVar13;
  }
  WriteUInt32ToUtf16CharSequence(uVar8,&chars);
  WriteUInt32ToUtf16CharSequence
            (*(uint32_t *)((this->super_MessageGenerator).descriptor_ + 4),&chars);
  if (*(int *)((this->super_MessageGenerator).descriptor_ + 4) == 0) {
    io::Printer::Print<>(printer,"java.lang.Object[] objects = null;");
  }
  else {
    io::Printer::Print<>(printer,"java.lang.Object[] objects = new java.lang.Object[] {\n");
    io::Printer::Indent(printer);
    WriteUInt32ToUtf16CharSequence
              ((uint32_t)
               (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header.
               _M_node_count,&chars);
    for (p_Var4 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var4 !=
        &(this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      args_1 = Context::GetOneofGeneratorInfo(this->context_,*(OneofDescriptor **)(p_Var4 + 1));
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,"\"$oneof_name$_\",\n\"$oneof_name$Case_\",\n",(char (*) [11])0x3e5415,
                 &args_1->name);
    }
    lVar12 = 0;
    iVar7 = 0;
    for (lVar10 = 0; pDVar6 = (this->super_MessageGenerator).descriptor_,
        lVar10 < *(int *)(pDVar6 + 4); lVar10 = lVar10 + 1) {
      pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar6 + 0x28) + lVar12));
      iVar1 = (*pIVar5->_vptr_ImmutableFieldLiteGenerator[2])(pIVar5);
      iVar7 = iVar7 + iVar1;
      lVar12 = lVar12 + 0x48;
    }
    uVar2 = (iVar7 + 0x1f) / 0x20;
    uVar11 = (long)(iVar7 + 0x1f) % 0x20 & 0xffffffff;
    this_01 = (java *)0x0;
    uVar8 = uVar2;
    if ((int)uVar2 < 1) {
      uVar8 = 0;
    }
    for (; uVar8 != (uint32_t)this_01; this_01 = (java *)(ulong)((uint32_t)this_01 + 1)) {
      GetBitFieldName_abi_cxx11_(&line,this_01,(int)uVar11);
      io::Printer::Print<char[15],std::__cxx11::string>
                (printer,"\"$bit_field_name$\",\n",(char (*) [15])"bit_field_name",&line);
      std::__cxx11::string::~string((string *)&line);
      uVar11 = extraout_RDX;
    }
    WriteUInt32ToUtf16CharSequence(uVar2,&chars);
    sorted_fields._M_t.
    super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl =
         (__uniq_ptr_data<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>,_true,_true>
          )SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
    uVar2 = 0;
    uVar8 = 0;
    for (lVar10 = 0; lVar10 < *(int *)((this->super_MessageGenerator).descriptor_ + 4);
        lVar10 = lVar10 + 1) {
      this_00 = *(FieldDescriptor **)
                 ((long)sorted_fields._M_t.
                        super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                        .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                        _M_head_impl + lVar10 * 8);
      bVar13 = FieldDescriptor::is_map(this_00);
      if (bVar13) {
        uVar2 = uVar2 + 1;
      }
      else {
        uVar8 = uVar8 + ((~(byte)this_00[1] & 0x60) == 0);
      }
    }
    WriteUInt32ToUtf16CharSequence
              (*(uint32_t *)
                (*(long *)sorted_fields._M_t.
                          super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                          .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                          _M_head_impl + 4),&chars);
    WriteUInt32ToUtf16CharSequence
              (*(uint32_t *)
                (*(long *)((long)sorted_fields._M_t.
                                 super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                 .
                                 super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>
                                 ._M_head_impl + -8 +
                          (long)*(int *)((this->super_MessageGenerator).descriptor_ + 4) * 8) + 4),
               &chars);
    WriteUInt32ToUtf16CharSequence
              (*(uint32_t *)((this->super_MessageGenerator).descriptor_ + 4),&chars);
    WriteUInt32ToUtf16CharSequence(uVar2,&chars);
    WriteUInt32ToUtf16CharSequence(uVar8,&chars);
    line.field_2._M_allocated_capacity = 0;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length = 0;
    lVar12 = 0;
    for (lVar10 = 0; pDVar6 = (this->super_MessageGenerator).descriptor_,
        lVar10 < *(int *)(pDVar6 + 4); lVar10 = lVar10 + 1) {
      lVar9 = *(long *)(pDVar6 + 0x28);
      if ((*(byte *)(lVar9 + 1 + lVar12) & 0x60) == 0x40) {
LAB_002fb84c:
        local_38 = (FieldDescriptor *)(lVar9 + lVar12);
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::emplace_back<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)&line,&local_38);
      }
      else {
        JVar3 = GetJavaType((FieldDescriptor *)(lVar9 + lVar12));
        if (JVar3 == JAVATYPE_MESSAGE) {
          pDVar6 = FieldDescriptor::message_type
                             ((FieldDescriptor *)
                              (*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) + lVar12
                              ));
          bVar13 = HasRequiredFields(pDVar6);
          if (bVar13) {
            lVar9 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x28);
            goto LAB_002fb84c;
          }
        }
      }
      lVar12 = lVar12 + 0x48;
    }
    WriteUInt32ToUtf16CharSequence
              ((uint32_t)(line._M_string_length - (long)line._M_dataplus._M_p >> 3),&chars);
    for (lVar10 = 0; lVar10 < *(int *)((this->super_MessageGenerator).descriptor_ + 4);
        lVar10 = lVar10 + 1) {
      pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,
                          *(FieldDescriptor **)
                           ((long)sorted_fields._M_t.
                                  super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                  .
                                  super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>
                                  ._M_head_impl + lVar10 * 8));
      (*pIVar5->_vptr_ImmutableFieldLiteGenerator[7])(pIVar5,printer,&chars);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"};\n");
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base((_Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)&line);
    std::
    unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ::~unique_ptr(&sorted_fields);
  }
  io::Printer::Print<>(printer,"java.lang.String info =\n");
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_allocated_capacity = line.field_2._M_allocated_capacity & 0xffffffffffffff00;
  for (uVar11 = 0;
      uVar11 < (ulong)((long)chars.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)chars.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 1); uVar11 = uVar11 + 1) {
    EscapeUtf16ToString(chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar11],&line);
    if (0x4f < line._M_string_length) {
      io::Printer::Print<char[7],std::__cxx11::string>
                (printer,"    \"$string$\" +\n",(char (*) [7])0x428a25,&line);
      line._M_string_length = 0;
      *line._M_dataplus._M_p = '\0';
    }
  }
  io::Printer::Print<char[7],std::__cxx11::string>
            (printer,"    \"$string$\";\n",(char (*) [7])0x428a25,&line);
  io::Printer::Print<>(printer,"return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  io::Printer::Outdent(printer);
  std::__cxx11::string::~string((string *)&line);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodNewBuildMessageInfo(
    io::Printer* printer) {
  printer->Indent();

  // Collect field info into a sequence of UTF-16 chars. It will be embedded
  // as a Java string in the generated code.
  std::vector<uint16_t> chars;

  int flags = 0;
  if (IsProto2(descriptor_->file())) {
    flags |= 0x1;
  }
  if (descriptor_->options().message_set_wire_format()) {
    flags |= 0x2;
  }
  WriteIntToUtf16CharSequence(flags, &chars);
  WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);

  if (descriptor_->field_count() == 0) {
    printer->Print("java.lang.Object[] objects = null;");
  } else {
    // A single array of all fields (including oneof, oneofCase, hasBits).
    printer->Print("java.lang.Object[] objects = new java.lang.Object[] {\n");
    printer->Indent();

    // Record the number of oneofs.
    WriteIntToUtf16CharSequence(oneofs_.size(), &chars);
    for (auto oneof : oneofs_) {
      printer->Print(
          "\"$oneof_name$_\",\n"
          "\"$oneof_name$Case_\",\n",
          "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name);
    }

    // Integers for bit fields.
    int total_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      total_bits +=
          field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
    }
    int total_ints = (total_bits + 31) / 32;
    for (int i = 0; i < total_ints; i++) {
      printer->Print("\"$bit_field_name$\",\n", "bit_field_name",
                     GetBitFieldName(i));
    }
    WriteIntToUtf16CharSequence(total_ints, &chars);

    int map_count = 0;
    int repeated_count = 0;
    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      if (field->is_map()) {
        map_count++;
      } else if (field->is_repeated()) {
        repeated_count++;
      }
    }

    WriteIntToUtf16CharSequence(sorted_fields[0]->number(), &chars);
    WriteIntToUtf16CharSequence(
        sorted_fields[descriptor_->field_count() - 1]->number(), &chars);
    WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);
    WriteIntToUtf16CharSequence(map_count, &chars);
    WriteIntToUtf16CharSequence(repeated_count, &chars);

    std::vector<const FieldDescriptor*> fields_for_is_initialized_check;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (descriptor_->field(i)->is_required() ||
          (GetJavaType(descriptor_->field(i)) == JAVATYPE_MESSAGE &&
           HasRequiredFields(descriptor_->field(i)->message_type()))) {
        fields_for_is_initialized_check.push_back(descriptor_->field(i));
      }
    }
    WriteIntToUtf16CharSequence(fields_for_is_initialized_check.size(), &chars);

    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      field_generators_.get(field).GenerateFieldInfo(printer, &chars);
    }
    printer->Outdent();
    printer->Print("};\n");
  }

  printer->Print("java.lang.String info =\n");
  std::string line;
  for (size_t i = 0; i < chars.size(); i++) {
    uint16_t code = chars[i];
    EscapeUtf16ToString(code, &line);
    if (line.size() >= 80) {
      printer->Print("    \"$string$\" +\n", "string", line);
      line.clear();
    }
  }
  printer->Print("    \"$string$\";\n", "string", line);

  printer->Print("return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  printer->Outdent();
}